

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O1

int oonf_cfg_apply(void)

{
  cfg_db *pcVar1;
  int iVar2;
  cfg_db *pcVar3;
  int iVar4;
  cfg_db *pcVar5;
  autobuf log;
  char *format;
  undefined1 local_50 [32];
  
  iVar2 = abuf_init(local_50);
  if (iVar2 != 0) {
    if ((log_global_mask[3] & 4) == 0) {
      return -1;
    }
    oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x15a,(void *)0x0,0,
             "Not enough memory for logging autobuffer");
    return -1;
  }
  if ((log_global_mask[3] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x15e,(void *)0x0,0,
             "Apply configuration");
  }
  iVar2 = oonf_cfg_update_globalcfg(true);
  if (iVar2 == 0) {
    iVar2 = oonf_cfg_load_subsystems();
    iVar4 = -1;
    if (iVar2 == 0) {
      iVar2 = cfg_schema_validate(_oonf_raw_db,0,config_global.failfast ^ 1,local_50);
      pcVar5 = _oonf_work_db;
      pcVar1 = _oonf_raw_db;
      if (iVar2 == 0) {
        pcVar3 = (cfg_db *)cfg_db_add();
        if ((pcVar3 != (cfg_db *)0x0) && (iVar2 = _cfg_db_append(pcVar3,pcVar1,0,0), iVar2 != 0)) {
          cfg_db_remove(pcVar3);
          pcVar3 = (cfg_db *)0x0;
        }
        if (pcVar3 == (cfg_db *)0x0) {
          _oonf_work_db = pcVar5;
          if ((log_global_mask[3] & 4) != 0) {
            _oonf_work_db = pcVar3;
            oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x17a,(void *)0x0,0,
                     "Not enough memory for duplicating work db");
            _oonf_work_db = pcVar5;
          }
          goto LAB_00104dc7;
        }
        _oonf_work_db = pcVar3;
        pcVar3->schema = &_oonf_schema;
        cfg_schema_validate(pcVar3,1,0,0);
        iVar2 = oonf_cfg_update_globalcfg(false);
        if (iVar2 == 0) {
          if (_first_apply == '\x01') {
            iVar2 = cfg_schema_handle_db_startup_changes(_oonf_work_db);
            if ((iVar2 != 0) && ((log_global_mask[3] & 4) != 0)) {
              oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",399,(void *)0x0,0,
                       "Handling changes failes");
            }
            _first_apply = '\0';
          }
          else {
            iVar2 = cfg_schema_handle_db_changes(pcVar5);
            if ((iVar2 != 0) && ((log_global_mask[3] & 4) != 0)) {
              oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x195,(void *)0x0,0,
                       "Handling changes failes");
            }
          }
          iVar4 = 0;
          _trigger_reload = 0;
          _trigger_commit = 0;
          cfg_db_remove(_oonf_raw_db);
          pcVar1 = _oonf_work_db;
          pcVar3 = (cfg_db *)cfg_db_add();
          if ((pcVar3 != (cfg_db *)0x0) && (iVar2 = _cfg_db_append(pcVar3,pcVar1,0,0,0), iVar2 != 0)
             ) {
            cfg_db_remove(pcVar3);
            pcVar3 = (cfg_db *)0x0;
          }
          _oonf_raw_db = pcVar3;
          pcVar3->schema = &_oonf_schema;
          goto LAB_00104dca;
        }
        if ((log_global_mask[3] & 4) == 0) goto LAB_00104dca;
        format = "Updating global config failed";
        iVar2 = 0x188;
      }
      else {
        _oonf_work_db = pcVar5;
        if ((log_global_mask[3] & 4) == 0) goto LAB_00104dc7;
        format = "Configuration validation failed: %s";
        pcVar5 = (cfg_db *)0x0;
        iVar2 = 0x170;
      }
LAB_00104daa:
      iVar4 = -1;
      oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",iVar2,(void *)0x0,0,format);
      goto LAB_00104dca;
    }
  }
  else if ((log_global_mask[3] & 4) != 0) {
    format = "Updating global config failed";
    pcVar5 = (cfg_db *)0x0;
    iVar2 = 0x165;
    goto LAB_00104daa;
  }
LAB_00104dc7:
  iVar4 = -1;
  pcVar5 = (cfg_db *)0x0;
LAB_00104dca:
  if (pcVar5 != (cfg_db *)0x0) {
    cfg_db_remove(pcVar5);
  }
  abuf_free(local_50);
  return iVar4;
}

Assistant:

int
oonf_cfg_apply(void) {
  struct cfg_db *old_db;
  struct autobuf log;
  int result;

  if (abuf_init(&log)) {
    OONF_WARN(LOG_CONFIG, "Not enough memory for logging autobuffer");
    return -1;
  }

  OONF_INFO(LOG_CONFIG, "Apply configuration");

  /*** phase 1: activate all plugins ***/
  result = -1;
  old_db = NULL;

  if (oonf_cfg_update_globalcfg(true)) {
    OONF_WARN(LOG_CONFIG, "Updating global config failed");
    goto apply_failed;
  }

  if (oonf_cfg_load_subsystems()) {
    goto apply_failed;
  }

  /*** phase 2: check configuration and apply it ***/
  /* validate configuration data */
  if (cfg_schema_validate(_oonf_raw_db, false, !config_global.failfast, &log)) {
    OONF_WARN(LOG_CONFIG, "Configuration validation failed: %s", abuf_getptr(&log));
    goto apply_failed;
  }

  /* backup old db */
  old_db = _oonf_work_db;

  /* create new configuration database with correct values */
  _oonf_work_db = cfg_db_duplicate(_oonf_raw_db);
  if (_oonf_work_db == NULL) {
    OONF_WARN(LOG_CONFIG, "Not enough memory for duplicating work db");
    _oonf_work_db = old_db;
    old_db = NULL;
    goto apply_failed;
  }

  /* bind schema */
  cfg_db_link_schema(_oonf_work_db, &_oonf_schema);

  /* remove everything not valid */
  cfg_schema_validate(_oonf_work_db, true, false, NULL);

  if (oonf_cfg_update_globalcfg(false)) {
    /* this should not happen at all */
    OONF_WARN(LOG_CONFIG, "Updating global config failed");
    goto apply_failed;
  }

  /* calculate delta and call handlers */
  if (_first_apply) {
    if (cfg_schema_handle_db_startup_changes(_oonf_work_db)) {
      OONF_WARN(LOG_CONFIG, "Handling changes failes");
    }
    _first_apply = false;
  }
  else {
    if (cfg_schema_handle_db_changes(old_db, _oonf_work_db)) {
      OONF_WARN(LOG_CONFIG, "Handling changes failes");
    }
  }

  /* success */
  result = 0;
  _trigger_reload = false;
  _trigger_commit = false;

  /* now get a new working copy of the committed settings */
  cfg_db_remove(_oonf_raw_db);
  _oonf_raw_db = cfg_db_duplicate(_oonf_work_db);
  cfg_db_link_schema(_oonf_raw_db, &_oonf_schema);

apply_failed:
  if (old_db) {
    cfg_db_remove(old_db);
  }

  abuf_free(&log);
  return result;
}